

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  uint *puVar1;
  curl_socket_t sockfd;
  imapstate iVar2;
  curl_usessl cVar3;
  SessionHandle *pSVar4;
  void *pvVar5;
  uint uVar6;
  CURLcode CVar7;
  _Bool _Var8;
  CURLcode CVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong maxlen;
  char *pcVar13;
  SessionHandle *pSVar14;
  smtp_conn *smtpc;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  int smtpcode;
  size_t nread;
  saslprogress local_50;
  undefined4 uStack_4c;
  uint local_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  pSVar4 = conn->data;
  local_38 = 0;
  CVar9 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_AUTHENTICATE) {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar9;
    }
    local_40 = (SASL *)&(conn->proto).imapc.sasl.state;
    do {
      CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_44,&local_38);
      uVar6 = local_44;
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      iVar2 = (conn->proto).imapc.state;
      if (local_44 != 1 && iVar2 != IMAP_APPEND_FINAL) {
        (pSVar4->info).httpcode = local_44;
      }
      if (local_44 == 0) {
        return CURLE_OK;
      }
      switch(iVar2) {
      case IMAP_SERVERGREET:
        if (local_44 - 200 < 100) {
          *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
          *(undefined4 *)((long)&conn->proto + 0x94) = 0;
          (conn->proto).ftpc.transfertype = '\0';
          (conn->proto).imapc.resptag[2] = '\0';
          CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"EHLO %s",(conn->proto).ftpc.dirs);
          if (CVar9 == CURLE_OK) {
            (conn->proto).imapc.state = IMAP_CAPABILITY;
          }
        }
        else {
          Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)local_44);
          CVar9 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        break;
      case IMAP_CAPABILITY:
        pSVar14 = conn->data;
        if (local_44 - 300 < 0xffffff9c && local_44 != 1) {
          if ((CURLUSESSL_TRY < (pSVar14->set).use_ssl) && (conn->ssl[0].use != true))
          goto LAB_00582b1b;
          *(undefined4 *)((long)&conn->proto + 0x94) = 0;
          CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
          if (CVar9 == CURLE_OK) {
            (conn->proto).imapc.state = IMAP_STARTTLS;
          }
        }
        else {
          sVar11 = strlen((pSVar14->state).buffer);
          uVar12 = sVar11 - 4;
          if ((uVar12 < 8) || (*(long *)((pSVar14->state).buffer + 4) != 0x534c545452415453)) {
            if ((uVar12 < 4) || (*(int *)((pSVar14->state).buffer + 4) != 0x455a4953)) {
              if ((4 < uVar12) &&
                 ((pSVar14->state).buffer[8] == ' ' &&
                  *(int *)((pSVar14->state).buffer + 4) == 0x48545541)) {
                (conn->proto).imapc.resptag[2] = '\x01';
                lVar16 = sVar11 - 9;
                pcVar13 = (pSVar14->state).buffer + 9;
LAB_00582bef:
                bVar17 = lVar16 == 0;
                pcVar15 = pcVar13;
                if (!bVar17) {
                  pcVar15 = pcVar13 + lVar16;
                  lVar16 = -lVar16;
                  bVar17 = false;
                  do {
                    if ((0x20 < (ulong)(byte)*pcVar13) ||
                       ((0x100002600U >> ((ulong)(byte)*pcVar13 & 0x3f) & 1) == 0)) {
                      uVar12 = 0;
                      goto LAB_00582c42;
                    }
                    pcVar13 = pcVar13 + 1;
                    lVar16 = lVar16 + 1;
                    bVar17 = lVar16 == 0;
                  } while (!bVar17);
                }
                lVar16 = 0;
                goto LAB_00582c2f;
              }
            }
            else {
              (conn->proto).imapc.resptag[1] = '\x01';
            }
          }
          else {
            (conn->proto).ftpc.transfertype = '\x01';
          }
LAB_00582d8e:
          CVar9 = CURLE_OK;
          if (uVar6 != 1) {
            cVar3 = (pSVar14->set).use_ssl;
            if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
              if ((conn->proto).ftpc.transfertype == '\x01') {
                CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
                if (CVar9 == CURLE_OK) {
                  (conn->proto).imapc.state = IMAP_UPGRADETLS;
                }
                break;
              }
              if (cVar3 != CURLUSESSL_TRY) {
                Curl_failf(pSVar14,"STARTTLS not supported.");
                goto LAB_00582a63;
              }
            }
LAB_00582db4:
            CVar9 = smtp_perform_authentication(conn);
          }
        }
        break;
      case IMAP_STARTTLS:
        if (local_44 - 200 < 100) goto switchD_00582854_caseD_5;
        pSVar14 = conn->data;
LAB_00582b1b:
        Curl_failf(pSVar14,"Remote access denied: %d",(ulong)local_44);
        CVar9 = CURLE_REMOTE_ACCESS_DENIED;
        break;
      case IMAP_UPGRADETLS:
        CVar9 = CURLE_NOT_BUILT_IN;
        if (local_44 != 0xdc) {
          if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_00582db4;
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_44);
LAB_00582a63:
          CVar9 = CURLE_USE_SSL_FAILED;
        }
        break;
      default:
switchD_00582854_caseD_5:
        (conn->proto).imapc.state = IMAP_STOP;
        goto LAB_005828ce;
      case IMAP_LOGIN:
        pSVar14 = conn->data;
        CVar9 = Curl_sasl_continue(local_40,conn,local_44,&local_50);
        if (CVar9 == CURLE_OK) {
          if (local_50 == SASL_IDLE) {
            Curl_failf(pSVar14,"Authentication cancelled");
            CVar9 = CURLE_LOGIN_DENIED;
          }
          else {
            CVar9 = CURLE_OK;
            CVar7 = CURLE_OK;
            if (local_50 == SASL_DONE) {
LAB_00582d26:
              CVar9 = CVar7;
              (conn->proto).imapc.state = IMAP_STOP;
            }
          }
        }
        break;
      case IMAP_LIST:
        pSVar14 = conn->data;
        pvVar5 = (pSVar14->req).protop;
        pcVar13 = (pSVar14->state).buffer;
        sVar11 = strlen(pcVar13);
        if (((((uVar6 - 300 < 0xffffff9c) && (*(long *)((long)pvVar5 + 0x10) != 0)) &&
             (uVar6 != 0x229)) && (uVar6 != 1)) ||
           (((uVar6 - 300 < 0xffffff9c && (uVar6 != 1)) && (*(long *)((long)pvVar5 + 0x10) == 0))))
        {
          Curl_failf(pSVar14,"Command failed: %d",(ulong)uVar6);
          CVar9 = CURLE_RECV_ERROR;
        }
        else {
          CVar9 = CURLE_OK;
          if ((pSVar14->set).opt_no_body == false) {
            pcVar13[sVar11] = '\n';
            CVar9 = Curl_client_write(conn,1,pcVar13,sVar11 + 1);
            pcVar13[sVar11] = '\0';
          }
          if (uVar6 != 1) {
            CVar7 = CVar9;
            if ((*(long *)((long)pvVar5 + 0x10) == 0) ||
               (lVar16 = *(long *)(*(long *)((long)pvVar5 + 0x10) + 8),
               *(long *)((long)pvVar5 + 0x10) = lVar16, lVar16 == 0)) goto LAB_00582d26;
            CVar9 = smtp_perform_command(conn);
          }
        }
        break;
      case IMAP_SELECT:
        if (local_44 - 200 < 100) {
LAB_00582a22:
          CVar9 = smtp_perform_rcpt_to(conn);
        }
        else {
          pSVar14 = conn->data;
          pcVar13 = "MAIL failed: %d";
LAB_00582cad:
          Curl_failf(pSVar14,pcVar13,(ulong)local_44);
          CVar9 = CURLE_SEND_ERROR;
        }
        break;
      case IMAP_FETCH:
        pSVar14 = conn->data;
        if (99 < local_44 - 200) {
          pcVar13 = "RCPT failed: %d";
          goto LAB_00582cad;
        }
        pvVar5 = (pSVar14->req).protop;
        lVar16 = *(long *)(*(long *)((long)pvVar5 + 0x10) + 8);
        *(long *)((long)pvVar5 + 0x10) = lVar16;
        if (lVar16 != 0) goto LAB_00582a22;
        CVar9 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
        if (CVar9 != CURLE_OK) break;
        (conn->proto).imapc.state = IMAP_FETCH_FINAL;
LAB_005828ce:
        CVar9 = CURLE_OK;
        break;
      case IMAP_FETCH_FINAL:
        pSVar14 = conn->data;
        if (local_44 != 0x162) {
          pcVar13 = "DATA failed: %d";
          goto LAB_00582cad;
        }
        Curl_pgrsSetUploadSize(pSVar14,(pSVar14->state).infilesize);
        CVar9 = CURLE_OK;
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        goto LAB_00582b09;
      case IMAP_APPEND:
        CVar9 = CURLE_RECV_ERROR;
        if (local_44 == 0xfa) {
          CVar9 = CURLE_OK;
        }
LAB_00582b09:
        (conn->proto).imapc.state = IMAP_STOP;
      }
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
      _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
      CVar9 = CURLE_OK;
    } while (_Var8);
  }
  return CVar9;
  while (uVar12 = uVar12 + 1, maxlen = -lVar16, uVar12 < (ulong)-lVar16) {
LAB_00582c42:
    if (((ulong)(byte)pcVar13[uVar12] < 0x21) &&
       (maxlen = uVar12, (0x100002600U >> ((ulong)(byte)pcVar13[uVar12] & 0x3f) & 1) != 0)) break;
  }
  uVar10 = Curl_sasl_decode_mech(pcVar13,maxlen,(size_t *)&local_50);
  if ((uVar10 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
    puVar1 = (uint *)((long)&conn->proto + 0x8c);
    *puVar1 = *puVar1 | uVar10;
  }
  pcVar15 = pcVar13 + maxlen;
  lVar16 = -(lVar16 + maxlen);
LAB_00582c2f:
  pcVar13 = pcVar15;
  if (bVar17) goto LAB_00582d8e;
  goto LAB_00582bef;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct SessionHandle *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}